

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
mpt::reference<mpt::layout::text>::reference
          (reference<mpt::layout::text> *this,reference<mpt::layout::text> *ref)

{
  reference<mpt::layout::text> *ref_local;
  reference<mpt::layout::text> *this_local;
  
  this->_ref = (text *)0x0;
  operator=(this,ref);
  return;
}

Assistant:

inline reference(const reference &ref) : _ref(0)
	{
		*this = ref;
	}